

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O3

void __thiscall re2::BitState::GrowStack(BitState *this)

{
  Job *pJVar1;
  size_type __n;
  Job *__dest;
  new_allocator<re2::Job> local_19;
  
  __n = (long)(int)(this->job_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
                   super__Tuple_impl<1UL,_re2::PODArray<re2::Job>::Deleter>.
                   super__Head_base<1UL,_re2::PODArray<re2::Job>::Deleter,_false> * 2;
  __dest = __gnu_cxx::new_allocator<re2::Job>::allocate(&local_19,__n,(void *)0x0);
  memmove(__dest,(this->job_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
                 super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl,(long)this->njob_ << 4);
  pJVar1 = (this->job_).ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>.
           _M_t.super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
           super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl;
  (this->job_).ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
  super__Head_base<0UL,_re2::Job_*,_false>._M_head_impl = __dest;
  if (pJVar1 != (Job *)0x0) {
    operator_delete(pJVar1);
  }
  (this->job_).ptr_._M_t.super___uniq_ptr_impl<re2::Job,_re2::PODArray<re2::Job>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::Job_*,_re2::PODArray<re2::Job>::Deleter>.
  super__Tuple_impl<1UL,_re2::PODArray<re2::Job>::Deleter>.
  super__Head_base<1UL,_re2::PODArray<re2::Job>::Deleter,_false> = (Deleter)SUB84(__n,0);
  return;
}

Assistant:

void BitState::GrowStack() {
  PODArray<Job> tmp(2*job_.size());
  memmove(tmp.data(), job_.data(), njob_*sizeof job_[0]);
  job_ = std::move(tmp);
}